

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv_resident_set_memory(size_t *rss)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  int local_438;
  int i;
  int fd;
  long val;
  ssize_t n;
  char *s;
  char buf [1024];
  size_t *rss_local;
  
  buf._1016_8_ = rss;
  do {
    iVar1 = open64("/proc/self/stat",0);
    bVar6 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar6 = *piVar2 == 4;
    }
  } while (bVar6);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    rss_local._4_4_ = -*piVar2;
  }
  else {
    do {
      sVar3 = read(iVar1,&s,0x3ff);
      bVar6 = false;
      if (sVar3 == -1) {
        piVar2 = __errno_location();
        bVar6 = *piVar2 == 4;
      }
    } while (bVar6);
    uv__close(iVar1);
    if (sVar3 == -1) {
      piVar2 = __errno_location();
      rss_local._4_4_ = -*piVar2;
    }
    else {
      buf[sVar3 + -8] = '\0';
      pcVar4 = strchr((char *)&s,0x20);
      if (((pcVar4 != (char *)0x0) && (pcVar4[1] == '(')) &&
         (n = (ssize_t)strchr(pcVar4 + 1,0x29), (char *)n != (char *)0x0)) {
        for (local_438 = 1; local_438 < 0x17; local_438 = local_438 + 1) {
          n = (ssize_t)strchr((char *)(n + 1),0x20);
          if ((char *)n == (char *)0x0) goto LAB_009ed077;
        }
        piVar2 = __errno_location();
        *piVar2 = 0;
        lVar5 = strtol((char *)n,(char **)0x0,10);
        piVar2 = __errno_location();
        if ((*piVar2 == 0) && (-1 < lVar5)) {
          iVar1 = getpagesize();
          *(long *)buf._1016_8_ = lVar5 * iVar1;
          return 0;
        }
      }
LAB_009ed077:
      rss_local._4_4_ = -0x16;
    }
  }
  return rss_local._4_4_;
}

Assistant:

int uv_resident_set_memory(size_t* rss) {
  char buf[1024];
  const char* s;
  ssize_t n;
  long val;
  int fd;
  int i;

  do
    fd = open("/proc/self/stat", O_RDONLY);
  while (fd == -1 && errno == EINTR);

  if (fd == -1)
    return -errno;

  do
    n = read(fd, buf, sizeof(buf) - 1);
  while (n == -1 && errno == EINTR);

  uv__close(fd);
  if (n == -1)
    return -errno;
  buf[n] = '\0';

  s = strchr(buf, ' ');
  if (s == NULL)
    goto err;

  s += 1;
  if (*s != '(')
    goto err;

  s = strchr(s, ')');
  if (s == NULL)
    goto err;

  for (i = 1; i <= 22; i++) {
    s = strchr(s + 1, ' ');
    if (s == NULL)
      goto err;
  }

  errno = 0;
  val = strtol(s, NULL, 10);
  if (errno != 0)
    goto err;
  if (val < 0)
    goto err;

  *rss = val * getpagesize();
  return 0;

err:
  return -EINVAL;
}